

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void MeCab::itoa<int>(int val,char *s)

{
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  
  uVar1 = (ulong)(uint)val;
  if (val < 0) {
    *s = '-';
    s = s + 1;
    uVar1 = (ulong)(uint)-val;
  }
  lVar2 = 0;
  for (; (int)uVar1 != 0; uVar1 = uVar1 / 10) {
    s[lVar2] = (byte)(uVar1 % 10) | 0x30;
    lVar2 = lVar2 + 1;
  }
  if (lVar2 == 0) {
    pcVar3 = s + 1;
    *s = '0';
  }
  else {
    pcVar3 = s + lVar2;
  }
  *pcVar3 = '\0';
  std::__reverse<char*>(s);
  return;
}

Assistant:

inline void itoa(T val, char *s) {
  char *t;
  T mod;

  if (val < 0) {
    *s++ = '-';
    val = -val;
  }
  t = s;

  while (val) {
    mod = val % 10;
    *t++ = static_cast<char>(mod) + '0';
    val /= 10;
  }

  if (s == t) *t++ = '0';
  *t = '\0';
  std::reverse(s, t);

  return;
}